

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply_property_conflict ply_grow_property(p_ply ply,p_ply_element_conflict element)

{
  p_ply_property_conflict property;
  p_ply_element_conflict element_local;
  p_ply ply_local;
  
  if (ply == (p_ply)0x0) {
    __assert_fail("ply",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x4a1,"p_ply_property ply_grow_property(p_ply, p_ply_element)");
  }
  if (element == (p_ply_element_conflict)0x0) {
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x4a2,"p_ply_property ply_grow_property(p_ply, p_ply_element)");
  }
  if ((element->property == (p_ply_property_conflict)0x0) && (element->nproperties != 0)) {
    __assert_fail("element->property || element->nproperties == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x4a3,"p_ply_property ply_grow_property(p_ply, p_ply_element)");
  }
  if ((element->property != (p_ply_property_conflict)0x0) && (element->nproperties < 1)) {
    __assert_fail("!element->property || element->nproperties > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x4a4,"p_ply_property ply_grow_property(p_ply, p_ply_element)");
  }
  ply_local = (p_ply)ply_grow_array(ply,&element->property,&element->nproperties,0x128);
  if (ply_local == (p_ply)0x0) {
    ply_local = (p_ply)0x0;
  }
  else {
    ply_property_init((p_ply_property_conflict)ply_local);
  }
  return (p_ply_property_conflict)ply_local;
}

Assistant:

static p_ply_property ply_grow_property(p_ply ply, p_ply_element element) {
    p_ply_property property = NULL;
    assert(ply);
    assert(element);
    assert(element->property || element->nproperties == 0);
    assert(!element->property || element->nproperties > 0);
    property = (p_ply_property) ply_grow_array(ply,
            (void **) &element->property,
            &element->nproperties, sizeof(t_ply_property));
    if (!property) return NULL;
    ply_property_init(property);
    return property;
}